

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O1

void __thiscall DCanvas::Dim(DCanvas *this,PalEntry color,float damount,int x1,int y1,int w,int h)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  if ((damount != 0.0) || (NAN(damount))) {
    iVar6 = this->Width;
    if (iVar6 - x1 != 0 && x1 <= iVar6) {
      iVar1 = this->Height;
      if (iVar1 - y1 != 0 && y1 <= iVar1) {
        iVar4 = w + x1;
        iVar7 = iVar6 - x1;
        if (iVar4 <= iVar6) {
          iVar7 = w;
        }
        iVar2 = iVar1 - y1;
        if (h + y1 <= iVar1) {
          iVar2 = h;
        }
        if (0 < iVar2 && 0 < iVar7) {
          iVar5 = (int)(damount * 64.0);
          iVar1 = this->Pitch;
          pbVar3 = this->Buffer + (long)(y1 * iVar1) + (long)x1;
          if (iVar6 < iVar4) {
            iVar4 = iVar6;
          }
          iVar6 = x1 - iVar4;
          do {
            do {
              uVar8 = Col2RGB8[0x40 - iVar5][*pbVar3] +
                      (((uint)color.field_0 & 0xff) * 0x40 * iVar5 & 0xfffffc00 |
                      (int)(((uint)color.field_0 >> 8 & 0xff) * iVar5) >> 4 |
                      ((uint)color.field_0 & 0xff0000) * iVar5 & 0xfff00000) | 0x1f07c1f;
              *pbVar3 = RGB32k.All[uVar8 >> 0xf & uVar8];
              pbVar3 = pbVar3 + 1;
              iVar6 = iVar6 + 1;
            } while (iVar6 != 0);
            pbVar3 = pbVar3 + (iVar1 - iVar7);
            iVar2 = iVar2 + -1;
            iVar6 = x1 - iVar4;
          } while (iVar2 != 0);
        }
      }
      return;
    }
  }
  return;
}

Assistant:

void DCanvas::Dim (PalEntry color, float damount, int x1, int y1, int w, int h)
{
	if (damount == 0.f)
		return;

	DWORD *bg2rgb;
	DWORD fg;
	int gap;
	BYTE *spot;
	int x, y;

	if (x1 >= Width || y1 >= Height)
	{
		return;
	}
	if (x1 + w > Width)
	{
		w = Width - x1;
	}
	if (y1 + h > Height)
	{
		h = Height - y1;
	}
	if (w <= 0 || h <= 0)
	{
		return;
	}

	{
		int amount;

		amount = (int)(damount * 64);
		bg2rgb = Col2RGB8[64-amount];

		fg = (((color.r * amount) >> 4) << 20) |
			  ((color.g * amount) >> 4) |
			 (((color.b * amount) >> 4) << 10);
	}

	spot = Buffer + x1 + y1*Pitch;
	gap = Pitch - w;
	for (y = h; y != 0; y--)
	{
		for (x = w; x != 0; x--)
		{
			DWORD bg;

			bg = bg2rgb[(*spot)&0xff];
			bg = (fg+bg) | 0x1f07c1f;
			*spot = RGB32k.All[bg&(bg>>15)];
			spot++;
		}
		spot += gap;
	}
}